

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

int64_t __thiscall
icu_63::CollationIterator::previousCE
          (CollationIterator *this,UVector32 *offsets,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32_t ce32;
  int iVar5;
  int64_t iVar6;
  CollationData *this_00;
  int64_t iStack_40;
  
  iVar3 = (this->ceBuffer).length;
  if (iVar3 < 1) {
    UVector32::removeAllElements(offsets);
    iVar3 = (*(this->super_UObject)._vptr_UObject[5])(this);
    iVar4 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (iVar4 < 0) {
      iStack_40 = 0x101000100;
    }
    else {
      iVar5 = iVar4;
      UVar1 = CollationData::isUnsafeBackward(this->data,iVar4,this->isNumeric);
      if (UVar1 != '\0') {
        iVar6 = previousCEUnsafe(this,iVar5,offsets,errorCode);
        return iVar6;
      }
      ce32 = CollationData::getCE32(this->data,iVar4);
      this_00 = this->data;
      if (ce32 == 0xc0) {
        this_00 = this_00->base;
        ce32 = CollationData::getCE32(this_00,iVar4);
      }
      UVar1 = Collation::isSimpleOrLongCE32(ce32);
      if (UVar1 != '\0') {
        iVar6 = Collation::ceFromCE32(ce32);
        return iVar6;
      }
      appendCEsFromCE32(this,this_00,iVar4,ce32,'\0',errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar4 = (this->ceBuffer).length;
        if (1 < iVar4) {
          iVar5 = (*(this->super_UObject)._vptr_UObject[5])(this);
          do {
            UVector32::addElement(offsets,iVar5,errorCode);
            iVar4 = (this->ceBuffer).length;
            iVar5 = iVar3;
          } while (offsets->count <= iVar4);
        }
        (this->ceBuffer).length = iVar4 + -1;
        iStack_40 = (this->ceBuffer).buffer.ptr[(long)iVar4 + -1];
      }
      else {
        iStack_40 = 1;
      }
    }
  }
  else {
    uVar2 = iVar3 - 1;
    (this->ceBuffer).length = uVar2;
    iStack_40 = (this->ceBuffer).buffer.ptr[uVar2];
  }
  return iStack_40;
}

Assistant:

int64_t
CollationIterator::previousCE(UVector32 &offsets, UErrorCode &errorCode) {
    if(ceBuffer.length > 0) {
        // Return the previous buffered CE.
        return ceBuffer.get(--ceBuffer.length);
    }
    offsets.removeAllElements();
    int32_t limitOffset = getOffset();
    UChar32 c = previousCodePoint(errorCode);
    if(c < 0) { return Collation::NO_CE; }
    if(data->isUnsafeBackward(c, isNumeric)) {
        return previousCEUnsafe(c, offsets, errorCode);
    }
    // Simple, safe-backwards iteration:
    // Get a CE going backwards, handle prefixes but no contractions.
    uint32_t ce32 = data->getCE32(c);
    const CollationData *d;
    if(ce32 == Collation::FALLBACK_CE32) {
        d = data->base;
        ce32 = d->getCE32(c);
    } else {
        d = data;
    }
    if(Collation::isSimpleOrLongCE32(ce32)) {
        return Collation::ceFromCE32(ce32);
    }
    appendCEsFromCE32(d, c, ce32, FALSE, errorCode);
    if(U_SUCCESS(errorCode)) {
        if(ceBuffer.length > 1) {
            offsets.addElement(getOffset(), errorCode);
            // For an expansion, the offset of each non-initial CE is the limit offset,
            // consistent with forward iteration.
            while(offsets.size() <= ceBuffer.length) {
                offsets.addElement(limitOffset, errorCode);
            };
        }
        return ceBuffer.get(--ceBuffer.length);
    } else {
        return Collation::NO_CE_PRIMARY;
    }
}